

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall HighsSparseMatrix::scaleRow(HighsSparseMatrix *this,HighsInt row,double rowScale)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      iVar7 = *piVar3;
      do {
        iVar2 = piVar3[lVar8 + 1];
        if (iVar7 < iVar2) {
          pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = (long)iVar7;
          do {
            if (piVar4[lVar6] == row) {
              pdVar5[lVar6] = pdVar5[lVar6] * rowScale;
            }
            lVar6 = lVar6 + 1;
          } while (iVar2 != lVar6);
        }
        lVar8 = lVar8 + 1;
        iVar7 = iVar2;
      } while (lVar8 != iVar1);
    }
  }
  else {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[row];
    lVar8 = (long)iVar1;
    iVar7 = piVar3[(long)row + 1];
    if (iVar1 < iVar7) {
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pdVar5[lVar8] = pdVar5[lVar8] * rowScale;
        lVar8 = lVar8 + 1;
      } while (iVar7 != lVar8);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}